

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<char*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char*,void> *this,char *str)

{
  char *pcVar1;
  size_type in_RCX;
  StringRef string;
  allocator<char> local_11;
  
  if (this == (StringMaker<char*,void> *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",&local_11);
  }
  else {
    pcVar1 = (char *)strlen((char *)this);
    string.m_size = in_RCX;
    string.m_start = pcVar1;
    Detail::convertIntoString_abi_cxx11_(__return_storage_ptr__,(Detail *)this,string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char*>::convert(char* str) { // NOLINT(readability-non-const-parameter)
    if (str) {
        return Detail::convertIntoString( str );
    } else {
        return{ "{null string}" };
    }
}